

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::UpdateTryMergeWindowIntoHostViewport(ImGuiWindow *window,ImGuiViewportP *viewport)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  ImGuiViewportP *pIVar5;
  ImGuiWindow *pIVar6;
  ImGuiViewportP *pIVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  
  pIVar8 = GImGui;
  pIVar5 = window->Viewport;
  if ((pIVar5 != viewport) && (((viewport->super_ImGuiViewport).Flags & 0x280U) == 0x200)) {
    fVar13 = (viewport->super_ImGuiViewport).Pos.x;
    fVar1 = (window->Pos).x;
    if (fVar1 < fVar13) {
      return false;
    }
    fVar2 = (viewport->super_ImGuiViewport).Pos.y;
    fVar3 = (window->Pos).y;
    if (fVar3 < fVar2) {
      return false;
    }
    fVar14 = (window->Size).x + fVar1;
    if (fVar13 + (viewport->super_ImGuiViewport).Size.x < fVar14) {
      return false;
    }
    fVar13 = (window->Size).y + fVar3;
    if (fVar2 + (viewport->super_ImGuiViewport).Size.y < fVar13) {
      return false;
    }
    bVar9 = GetWindowAlwaysWantOwnViewport(window);
    if (!bVar9) {
      iVar4 = (pIVar8->Windows).Size;
      lVar10 = (long)iVar4;
      if (lVar10 < 1) {
        bVar9 = true;
      }
      else {
        lVar11 = 0;
        do {
          pIVar6 = (pIVar8->Windows).Data[lVar11];
          if (pIVar6 == window) {
            iVar12 = 2;
            bVar9 = false;
          }
          else {
            if (((pIVar6->WasActive == true) && (pIVar6->ViewportOwned == true)) &&
               ((pIVar6->Flags & 0x1000000) == 0)) {
              pIVar7 = pIVar6->Viewport;
              fVar2 = (pIVar7->super_ImGuiViewport).Pos.y;
              if (((fVar3 < (pIVar7->super_ImGuiViewport).Size.y + fVar2) && (fVar2 < fVar13)) &&
                 ((fVar2 = (pIVar7->super_ImGuiViewport).Pos.x,
                  fVar1 < (pIVar7->super_ImGuiViewport).Size.x + fVar2 && (fVar2 < fVar14)))) {
                bVar9 = false;
                iVar12 = 1;
                goto LAB_001244a0;
              }
            }
            iVar12 = 0;
            bVar9 = true;
          }
LAB_001244a0:
          if (!bVar9) goto LAB_001244b2;
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
        iVar12 = 2;
LAB_001244b2:
        bVar9 = iVar12 == 2;
      }
      if (bVar9) {
        if ((0 < iVar4) && (window->ViewportOwned != false)) {
          lVar11 = 0;
          do {
            if ((pIVar8->Windows).Size <= lVar11) {
              __assert_fail("i >= 0 && i < Size",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                            ,0x5c2,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]"
                           );
            }
            pIVar6 = (pIVar8->Windows).Data[lVar11];
            if (pIVar6->Viewport == pIVar5) {
              pIVar6->Viewport = viewport;
              pIVar6->ViewportId = (viewport->super_ImGuiViewport).ID;
              pIVar6->ViewportOwned = viewport->Window == pIVar6;
            }
            lVar11 = lVar11 + 1;
          } while (lVar10 != lVar11);
        }
        window->Viewport = viewport;
        window->ViewportId = (viewport->super_ImGuiViewport).ID;
        window->ViewportOwned = viewport->Window == window;
        BringWindowToDisplayFront(window);
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool ImGui::UpdateTryMergeWindowIntoHostViewport(ImGuiWindow* window, ImGuiViewportP* viewport)
{
    ImGuiContext& g = *GImGui;
    if (window->Viewport == viewport)
        return false;
    if ((viewport->Flags & ImGuiViewportFlags_CanHostOtherWindows) == 0)
        return false;
    if ((viewport->Flags & ImGuiViewportFlags_Minimized) != 0)
        return false;
    if (!viewport->GetMainRect().Contains(window->Rect()))
        return false;
    if (GetWindowAlwaysWantOwnViewport(window))
        return false;

    for (int n = 0; n < g.Windows.Size; n++)
    {
        ImGuiWindow* window_behind = g.Windows[n];
        if (window_behind == window)
            break;
        if (window_behind->WasActive && window_behind->ViewportOwned && !(window_behind->Flags & ImGuiWindowFlags_ChildWindow))
            if (window_behind->Viewport->GetMainRect().Overlaps(window->Rect()))
                return false;
    }

    // Move to the existing viewport, Move child/hosted windows as well (FIXME-OPT: iterate child)
    ImGuiViewportP* old_viewport = window->Viewport;
    if (window->ViewportOwned)
        for (int n = 0; n < g.Windows.Size; n++)
            if (g.Windows[n]->Viewport == old_viewport)
                SetWindowViewport(g.Windows[n], viewport);
    SetWindowViewport(window, viewport);
    BringWindowToDisplayFront(window);

    return true;
}